

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O0

DifferenceReport *
flow::diagnostics::difference
          (DifferenceReport *__return_storage_ptr__,BufferedReport *first,BufferedReport *second)

{
  bool bVar1;
  reference pMVar2;
  Message *m_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  BufferedReport *__range2_1;
  Message *m;
  const_iterator __end2;
  const_iterator __begin2;
  BufferedReport *__range2;
  BufferedReport *second_local;
  BufferedReport *first_local;
  DifferenceReport *diff;
  
  std::
  pair<std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
  ::
  pair<std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>,_true>
            (__return_storage_ptr__);
  __end2 = BufferedReport::begin(first);
  m = (Message *)BufferedReport::end(first);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
                                     *)&m), bVar1) {
    pMVar2 = __gnu_cxx::
             __normal_iterator<const_flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
             ::operator*(&__end2);
    bVar1 = BufferedReport::contains(second,pMVar2);
    if (!bVar1) {
      std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::
      push_back(&__return_storage_ptr__->first,pMVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = BufferedReport::begin(second);
  m_1 = (Message *)BufferedReport::end(second);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
                             *)&m_1), bVar1) {
    pMVar2 = __gnu_cxx::
             __normal_iterator<const_flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
             ::operator*(&__end2_1);
    bVar1 = BufferedReport::contains(first,pMVar2);
    if (!bVar1) {
      std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::
      push_back(&__return_storage_ptr__->second,pMVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
    ::operator++(&__end2_1);
  }
  return __return_storage_ptr__;
}

Assistant:

DifferenceReport difference(const BufferedReport& first, const BufferedReport& second) {
  DifferenceReport diff;

  for (const Message& m: first)
    if (!second.contains(m))
      diff.first.push_back(m);

  for (const Message& m: second)
    if (!first.contains(m))
      diff.second.push_back(m);

  return diff;
}